

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O2

void prf_face_get_material(prf_node_t *node,prf_state_t *state,prf_material_t *material)

{
  uint8_t *puVar1;
  
  prf_error(9,"using prf_face_get_material() - not implemented");
  puVar1 = node->data;
  if (-1 < *(short *)(puVar1 + 0x1a)) {
    prf_state_material_lookup(state,(int)*(short *)(puVar1 + 0x1a),material);
    if (2 < puVar1[0x2c] - 1) {
      if (puVar1[0x2c] != 0) {
        prf_warn(9,"unknown face (0x%p) light mode (%d)",node);
        return;
      }
      if ((*(uint *)(puVar1 + 0x28) >> 0x1e & 1) != 0) {
        prf_warn(6,"light mode = face color: face NO_COLOR");
        return;
      }
      if ((*(uint *)(puVar1 + 0x28) >> 0x1c & 1) == 0) {
        prf_state_color_lookup(state,(uint)*(ushort *)(puVar1 + 0x10),0);
        return;
      }
    }
  }
  return;
}

Assistant:

void
prf_face_get_material(
    prf_node_t * node,
    prf_state_t * state,
    prf_material_t * material )
{
    node_data * data;
    prf_model_t * model;

    assert( node != NULL && state != NULL && material != NULL );
    prf_error( 9, "using prf_face_get_material() - not implemented" );

    data = (node_data *) node->data;
    model = state->model;

    if ( (data->material_index & 0x8000) == 0 ) {
        /* non-negative material index */
        prf_state_material_lookup( state, data->material_index, material );
        if ( data->light_mode == PRF_FACE_LIGHT_MODE_FACE_COLOR ) {
            if ( data->flags & PRF_FACE_FLAGS_NO_COLOR ){
                prf_warn( 6, "light mode = face color: face NO_COLOR" );
            } else if ( (data->flags & PRF_FACE_FLAGS_PACKED_COLOR) != 0 ) {
                float a, b, g, r;
                a = data->packed_color_primary >> 24;
                b = (data->packed_color_primary >> 16) & 0xff;
                g = (data->packed_color_primary >> 8) & 0xff;
                r = data->packed_color_primary & 0xff;
            } else {
                (void)prf_state_color_lookup( state, data->color_name_index, 0 );
            }
        } else if ( data->light_mode == PRF_FACE_LIGHT_MODE_VERTEX_COLORS ) {
            // FIXME: implement proper action
        } else if ( data->light_mode == 
                    PRF_FACE_LIGHT_MODE_FACE_COLOR_AND_NORMALS ) {
            // FIXME: implement proper action
        } else if ( data->light_mode ==
                    PRF_FACE_LIGHT_MODE_VERTEX_COLORS_AND_NORMALS ) {
            // FIXME: implement proper action
        } else {
            prf_warn( 9, "unknown face (0x%p) light mode (%d)", node,
                data->light_mode );
        }

    } else {
#if 0 /* not implemented */
        float r, g, b, a;
        /* no material - create default one */
        if ( data->flags & PRF_FACE_FLAGS_NO_COLOR ) {
        }
#endif /* 0 - not implemented yet */
    }
    /* deal with state->object_transparency & data->transparency */
}